

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O3

void __thiscall
glslang::TParseContextBase::checkIndex
          (TParseContextBase *this,TSourceLoc *loc,TType *type,int *index)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermTyped *pTVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (*index < 0) {
    iVar1 = 0;
    (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
              (this,loc,"","[","index out of range \'%d\'");
  }
  else {
    iVar1 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = (*type->_vptr_TType[0x1b])(type);
      if ((char)iVar1 == '\0') {
        iVar1 = (*type->_vptr_TType[0x1c])(type);
        if ((char)iVar1 == '\0') {
          if ((type->field_0xb & 8) == 0) {
            return;
          }
          iVar1 = *index;
          iVar2 = TType::computeNumComponents(type);
          if (iVar1 < iVar2) {
            return;
          }
          (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                    (this,loc,"","[","cooperative vector index out of range \'%d\'",
                     (ulong)(uint)*index);
          iVar1 = TType::computeNumComponents(type);
        }
        else {
          iVar1 = *index;
          iVar2 = (*type->_vptr_TType[0xd])(type);
          if (iVar1 < iVar2) {
            return;
          }
          (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                    (this,loc,"","[","matrix index out of range \'%d\'",(ulong)(uint)*index);
          iVar1 = (*type->_vptr_TType[0xd])(type);
        }
      }
      else {
        iVar1 = *index;
        iVar2 = (*type->_vptr_TType[0xc])(type);
        if (iVar1 < iVar2) {
          return;
        }
        (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                  (this,loc,"","[","vector index out of range \'%d\'",(ulong)(uint)*index);
        iVar1 = (*type->_vptr_TType[0xc])(type);
      }
    }
    else {
      iVar1 = (*type->_vptr_TType[0x1e])();
      if ((char)iVar1 == '\0') {
        return;
      }
      iVar1 = (*type->_vptr_TType[0x3a])(type);
      if ((char)iVar1 != '\0') {
        iVar1 = (*type->_vptr_TType[0x13])(type);
        pTVar3 = TSmallArrayVector::frontNode((TSmallArrayVector *)CONCAT44(extraout_var,iVar1));
        if (pTVar3 != (TIntermTyped *)0x0) {
          iVar1 = (*type->_vptr_TType[0x13])(type);
          pTVar3 = TSmallArrayVector::frontNode
                             ((TSmallArrayVector *)CONCAT44(extraout_var_00,iVar1));
          iVar1 = (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar3);
          if (CONCAT44(extraout_var_01,iVar1) == 0) {
            return;
          }
        }
      }
      iVar1 = *index;
      iVar2 = (*type->_vptr_TType[0xf])(type);
      if (iVar1 < iVar2) {
        return;
      }
      (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                (this,loc,"","[","array index out of range \'%d\'",(ulong)(uint)*index);
      iVar1 = (*type->_vptr_TType[0xf])(type);
    }
    iVar1 = iVar1 + -1;
  }
  *index = iVar1;
  return;
}

Assistant:

void TParseContextBase::checkIndex(const TSourceLoc& loc, const TType& type, int& index)
{
    const auto sizeIsSpecializationExpression = [&type]() {
        return type.containsSpecializationSize() &&
               type.getArraySizes()->getOuterNode() != nullptr &&
               type.getArraySizes()->getOuterNode()->getAsSymbolNode() == nullptr; };

    if (index < 0) {
        error(loc, "", "[", "index out of range '%d'", index);
        index = 0;
    } else if (type.isArray()) {
        if (type.isSizedArray() && !sizeIsSpecializationExpression() &&
            index >= type.getOuterArraySize()) {
            error(loc, "", "[", "array index out of range '%d'", index);
            index = type.getOuterArraySize() - 1;
        }
    } else if (type.isVector()) {
        if (index >= type.getVectorSize()) {
            error(loc, "", "[", "vector index out of range '%d'", index);
            index = type.getVectorSize() - 1;
        }
    } else if (type.isMatrix()) {
        if (index >= type.getMatrixCols()) {
            error(loc, "", "[", "matrix index out of range '%d'", index);
            index = type.getMatrixCols() - 1;
        }
    } else if (type.isCoopVecNV()) {
        if (index >= type.computeNumComponents()) {
            error(loc, "", "[", "cooperative vector index out of range '%d'", index);
            index = type.computeNumComponents() - 1;
        }
    }
}